

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

int64_t hdr_value_at_percentile(hdr_histogram *h,double percentile)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  
  dVar11 = percentile;
  if (100.0 <= percentile) {
    dVar11 = 100.0;
  }
  lVar3 = (long)((double)h->total_count * (dVar11 / 100.0) + 0.5);
  lVar5 = 1;
  if (1 < lVar3) {
    lVar5 = lVar3;
  }
  if ((long)h->counts_len < 1) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    lVar3 = 0;
    lVar10 = 0;
    do {
      lVar10 = lVar10 + h->counts[lVar3];
      if (lVar5 <= lVar10) {
        uVar1 = (uint)lVar3;
        bVar7 = (byte)h->sub_bucket_half_count_magnitude & 0x1f;
        uVar2 = uVar1 >> bVar7;
        cVar6 = (char)uVar2 + -1;
        if (uVar2 == 0) {
          cVar6 = '\0';
        }
        if (uVar1 >> bVar7 != 0) {
          uVar2 = h->sub_bucket_half_count;
        }
        uVar9 = (long)(int)(uVar2 + (h->sub_bucket_half_count + 0x7fffffffU & uVar1)) <<
                (cVar6 + (char)h->unit_magnitude & 0x3fU);
        break;
      }
      lVar3 = lVar3 + 1;
    } while (h->counts_len != lVar3);
  }
  uVar4 = h->sub_bucket_mask | uVar9;
  lVar5 = 0x3f;
  if (uVar4 != 0) {
    for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  bVar7 = 0x3f - (((byte)lVar5 ^ 0x3f) + (char)h->sub_bucket_half_count_magnitude);
  iVar8 = (int)((long)uVar9 >> (bVar7 & 0x3f));
  lVar5 = (long)iVar8 << (bVar7 & 0x3f);
  if ((percentile == 0.0) && (!NAN(percentile))) {
    return lVar5;
  }
  return lVar5 + (1L << (bVar7 + (h->sub_bucket_count <= iVar8) & 0x3f)) + -1;
}

Assistant:

int64_t hdr_value_at_percentile(const struct hdr_histogram* h, double percentile)
{
    double requested_percentile = percentile < 100.0 ? percentile : 100.0;
    int64_t count_at_percentile =
        (int64_t) (((requested_percentile / 100) * h->total_count) + 0.5);
    int64_t value_from_idx = get_value_from_idx_up_to_count(h, count_at_percentile);
    if (percentile == 0.0)
    {
        return lowest_equivalent_value(h, value_from_idx);
    }
    return highest_equivalent_value(h, value_from_idx);
}